

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O3

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2product1<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  bool bVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  uint uVar5;
  pointer pnVar6;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint *puVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  Item *pIVar18;
  ulong uVar19;
  byte bVar20;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nzval;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar20 = 0;
  iVar8 = *(x->super_IdxSet).idx;
  pnVar6 = (x->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar14 = (uint *)(pnVar6 + iVar8);
  pcVar15 = &local_130;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pcVar15->data)._M_elems[0] = *puVar14;
    puVar14 = puVar14 + 1;
    pcVar15 = (cpp_dec_float<200U,_int,_void> *)((pcVar15->data)._M_elems + 1);
  }
  iVar2 = pnVar6[iVar8].m_backend.exp;
  local_130.exp = iVar2;
  bVar1 = pnVar6[iVar8].m_backend.neg;
  local_130.neg = bVar1;
  fVar3 = pnVar6[iVar8].m_backend.fpclass;
  local_130.fpclass = fVar3;
  iVar4 = pnVar6[iVar8].m_backend.prec_elem;
  local_130.prec_elem = iVar4;
  pIVar18 = (A->set).theitem + (A->set).thekey[iVar8].idx;
  pcVar15 = &local_130;
  pcVar16 = &local_b0;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pcVar16->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
    pcVar15 = (cpp_dec_float<200U,_int,_void> *)((pcVar15->data)._M_elems + 1);
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((pcVar16->data)._M_elems + 1);
  }
  a = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
  local_b0.exp = iVar2;
  local_b0.neg = bVar1;
  local_b0.fpclass = fVar3;
  local_b0.prec_elem = iVar4;
  if ((bVar1 == true) && (local_b0.data._M_elems[0] != 0 || fVar3 != cpp_dec_float_finite)) {
    local_b0.neg = false;
  }
  if ((fVar3 != cpp_dec_float_NaN) && (!NAN(a))) {
    local_1b8.fpclass = cpp_dec_float_finite;
    local_1b8.prec_elem = 0x1c;
    local_1b8.data._M_elems[0] = 0;
    local_1b8.data._M_elems[1] = 0;
    local_1b8.data._M_elems[2] = 0;
    local_1b8.data._M_elems[3] = 0;
    local_1b8.data._M_elems[4] = 0;
    local_1b8.data._M_elems[5] = 0;
    local_1b8.data._M_elems[6] = 0;
    local_1b8.data._M_elems[7] = 0;
    local_1b8.data._M_elems[8] = 0;
    local_1b8.data._M_elems[9] = 0;
    local_1b8.data._M_elems[10] = 0;
    local_1b8.data._M_elems[0xb] = 0;
    local_1b8.data._M_elems[0xc] = 0;
    local_1b8.data._M_elems[0xd] = 0;
    local_1b8.data._M_elems[0xe] = 0;
    local_1b8.data._M_elems[0xf] = 0;
    local_1b8.data._M_elems[0x10] = 0;
    local_1b8.data._M_elems[0x11] = 0;
    local_1b8.data._M_elems[0x12] = 0;
    local_1b8.data._M_elems[0x13] = 0;
    local_1b8.data._M_elems[0x14] = 0;
    local_1b8.data._M_elems[0x15] = 0;
    local_1b8.data._M_elems[0x16] = 0;
    local_1b8.data._M_elems[0x17] = 0;
    local_1b8.data._M_elems[0x18] = 0;
    local_1b8.data._M_elems[0x19] = 0;
    local_1b8.data._M_elems._104_5_ = 0;
    local_1b8.data._M_elems[0x1b]._1_3_ = 0;
    local_1b8.exp = 0;
    local_1b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_1b8,a);
    iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_b0,&local_1b8);
    if (iVar8 < 1) goto LAB_0051c760;
  }
  uVar5 = (pIVar18->data).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused;
  uVar9 = (ulong)uVar5;
  if (uVar9 != 0) {
    *(uint *)(this + 8) = uVar5;
    if ((int)uVar5 < 1) {
      return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this;
    }
    uVar19 = uVar9 + 1;
    lVar11 = uVar9 * 0x84;
    do {
      pNVar7 = (pIVar18->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)&pNVar7[-1].val.m_backend.data + lVar11);
      *(undefined4 *)(*(long *)(this + 0x10) + -8 + uVar19 * 4) =
           *(undefined4 *)((long)(&pNVar7[-1].val + 1) + lVar11);
      local_1b8.fpclass = cpp_dec_float_finite;
      local_1b8.prec_elem = 0x1c;
      local_1b8.data._M_elems[0] = 0;
      local_1b8.data._M_elems[1] = 0;
      local_1b8.data._M_elems[2] = 0;
      local_1b8.data._M_elems[3] = 0;
      local_1b8.data._M_elems[4] = 0;
      local_1b8.data._M_elems[5] = 0;
      local_1b8.data._M_elems[6] = 0;
      local_1b8.data._M_elems[7] = 0;
      local_1b8.data._M_elems[8] = 0;
      local_1b8.data._M_elems[9] = 0;
      local_1b8.data._M_elems[10] = 0;
      local_1b8.data._M_elems[0xb] = 0;
      local_1b8.data._M_elems[0xc] = 0;
      local_1b8.data._M_elems[0xd] = 0;
      local_1b8.data._M_elems[0xe] = 0;
      local_1b8.data._M_elems[0xf] = 0;
      local_1b8.data._M_elems[0x10] = 0;
      local_1b8.data._M_elems[0x11] = 0;
      local_1b8.data._M_elems[0x12] = 0;
      local_1b8.data._M_elems[0x13] = 0;
      local_1b8.data._M_elems[0x14] = 0;
      local_1b8.data._M_elems[0x15] = 0;
      local_1b8.data._M_elems[0x16] = 0;
      local_1b8.data._M_elems[0x17] = 0;
      local_1b8.data._M_elems[0x18] = 0;
      local_1b8.data._M_elems[0x19] = 0;
      local_1b8.data._M_elems._104_5_ = 0;
      local_1b8.data._M_elems[0x1b]._1_3_ = 0;
      local_1b8.exp = 0;
      local_1b8.neg = false;
      pcVar15 = &local_130;
      if (pcVar16 != &local_1b8) {
        pcVar17 = &local_1b8;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pcVar17->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar20 * -8 + 4);
        }
        local_1b8.exp = local_130.exp;
        local_1b8.neg = local_130.neg;
        local_1b8.prec_elem = local_130.prec_elem;
        local_1b8.fpclass = local_130.fpclass;
        pcVar15 = pcVar16;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_1b8,pcVar15);
      lVar12 = *(long *)(this + 0x20);
      lVar10 = (long)(int)pcVar16[1].data._M_elems[0] * 0x80;
      pcVar15 = &local_1b8;
      puVar14 = (uint *)(lVar12 + lVar10);
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar14 = (pcVar15->data)._M_elems[0];
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar20 * -8 + 4);
        puVar14 = puVar14 + (ulong)bVar20 * -2 + 1;
      }
      *(int *)(lVar12 + 0x70 + lVar10) = local_1b8.exp;
      *(bool *)(lVar12 + 0x74 + lVar10) = local_1b8.neg;
      *(undefined8 *)(lVar12 + 0x78 + lVar10) = local_1b8._120_8_;
      uVar19 = uVar19 - 1;
      lVar11 = lVar11 + -0x84;
    } while (1 < uVar19);
    return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)this;
  }
LAB_0051c760:
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2product1(const SVSetBase<S>& A, const SSVectorBase<T>& x)
{
   assert(x.isSetup());
   assert(x.size() == 1);

   // get the nonzero value of x and the corresponding vector in A:
   const int nzidx = x.idx[0];
   const T nzval = x.val[nzidx];
   const SVectorBase<S>& Ai = A[nzidx];

   // compute A[nzidx] * nzval:
   if(isZero(nzval, this->tolerances()->epsilon()) || Ai.size() == 0)
      clear();    // this := zero vector
   else
   {
      num = Ai.size();

      for(int j = num - 1; j >= 0; --j)
      {
         const Nonzero<S>& Aij = Ai.element(j);
         idx[j] = Aij.idx;
         VectorBase<R>::val[Aij.idx] = nzval * Aij.val;
      }
   }

   assert(isConsistent());

   return *this;
}